

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O3

void __thiscall PyServerSession::on_invalid_packet(PyServerSession *this)

{
  function overload;
  object o;
  gil_scoped_acquire gil;
  object local_28;
  object local_20;
  gil_scoped_acquire local_18;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_18);
  pybind11::get_overload<ki::protocol::net::ServerSession>
            ((pybind11 *)&local_28,&this->super_ServerSession,"on_invalid_packet");
  if (local_28.super_handle.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_20);
    pybind11::object::~object(&local_20);
  }
  pybind11::object::~object(&local_28);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_18);
  return;
}

Assistant:

PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerSession,
            on_invalid_packet, );
    }
    void on_application_message(const ki::protocol::net::PacketHeader &header) override
    {
        PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerSession,
            on_application_message, header);
    }